

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haptic.c
# Opt level: O3

_Bool al_upload_and_play_haptic_effect
                (ALLEGRO_HAPTIC *hap,ALLEGRO_HAPTIC_EFFECT *effect,ALLEGRO_HAPTIC_EFFECT_ID *id,
                int loop)

{
  _Bool _Var1;
  
  _Var1 = (*haptic_driver->upload_effect)(hap,effect,id);
  if (_Var1) {
    _Var1 = (*haptic_driver->play_effect)(id,loop);
    if (_Var1) {
      return true;
    }
    (*haptic_driver->release_effect)(id);
  }
  return false;
}

Assistant:

bool al_upload_and_play_haptic_effect(ALLEGRO_HAPTIC *hap,
   ALLEGRO_HAPTIC_EFFECT *effect, ALLEGRO_HAPTIC_EFFECT_ID *id, int loop)
{
   ASSERT(hap);
   ASSERT(effect);
   ASSERT(id);

   if (!al_upload_haptic_effect(hap, effect, id))
      return false;
   /* If playing the effect failed, unload the haptic effect automatically 
    */
   if (!al_play_haptic_effect(id, loop)) {
     al_release_haptic_effect(id);
     return false;
   }
   return true;
}